

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::clone_impl<boost::exception_detail::bad_alloc_>::clone_impl(void *param_1)

{
  exception *unaff_retaddr;
  bad_alloc_ *in_stack_ffffffffffffffc8;
  exception *in_stack_fffffffffffffff8;
  
  clone_base::clone_base((clone_base *)((long)param_1 + 0x30));
  bad_alloc_::bad_alloc_((bad_alloc_ *)param_1,in_stack_ffffffffffffffc8);
  (((bad_alloc_ *)param_1)->super_exception)._vptr_exception = (_func_int **)0x304360;
  *(undefined8 *)&((bad_alloc_ *)param_1)->super_bad_alloc = 0x304390;
  (((bad_alloc_ *)((long)param_1 + 0x30))->super_exception)._vptr_exception = (_func_int **)0x3043d0
  ;
  copy_boost_exception(unaff_retaddr,in_stack_fffffffffffffff8);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }